

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VtabMakeWritable(Parse *pParse,Table *pTab)

{
  uint uVar1;
  int iVar2;
  Table **ppTVar3;
  ulong uVar4;
  ulong uVar5;
  Parse *pPVar6;
  
  pPVar6 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar6 = pParse;
  }
  uVar1 = pPVar6->nVtabLock;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    if (uVar5 == uVar4) {
      ppTVar3 = (Table **)sqlite3_realloc(pPVar6->apVtabLock,uVar1 * 8 + 8);
      if (ppTVar3 != (Table **)0x0) {
        pPVar6->apVtabLock = ppTVar3;
        iVar2 = pPVar6->nVtabLock;
        pPVar6->nVtabLock = iVar2 + 1;
        ppTVar3[iVar2] = pTab;
        return;
      }
      pPVar6->db->mallocFailed = '\x01';
      return;
    }
    ppTVar3 = pPVar6->apVtabLock + uVar4;
    uVar4 = uVar4 + 1;
  } while (*ppTVar3 != pTab);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabMakeWritable(Parse *pParse, Table *pTab){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i, n;
  Table **apVtabLock;

  assert( IsVirtual(pTab) );
  for(i=0; i<pToplevel->nVtabLock; i++){
    if( pTab==pToplevel->apVtabLock[i] ) return;
  }
  n = (pToplevel->nVtabLock+1)*sizeof(pToplevel->apVtabLock[0]);
  apVtabLock = sqlite3_realloc(pToplevel->apVtabLock, n);
  if( apVtabLock ){
    pToplevel->apVtabLock = apVtabLock;
    pToplevel->apVtabLock[pToplevel->nVtabLock++] = pTab;
  }else{
    pToplevel->db->mallocFailed = 1;
  }
}